

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O1

void FAudio_INTERNAL_Mix_2in_8out_Scalar
               (uint32_t toMix,uint32_t UNUSED1,uint32_t UNUSED2,float *src,float *dst,
               float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  long lVar19;
  
  if (toMix != 0) {
    fVar1 = coefficients[6];
    fVar2 = coefficients[4];
    fVar3 = *coefficients;
    fVar4 = coefficients[1];
    fVar5 = coefficients[2];
    fVar6 = coefficients[3];
    fVar7 = coefficients[7];
    fVar8 = coefficients[5];
    fVar9 = coefficients[0xe];
    fVar10 = coefficients[0xc];
    fVar11 = coefficients[10];
    fVar12 = coefficients[8];
    fVar13 = coefficients[0xf];
    fVar14 = coefficients[0xd];
    fVar15 = coefficients[0xb];
    fVar16 = coefficients[9];
    lVar19 = 0;
    do {
      fVar17 = src[lVar19 * 2];
      fVar18 = src[lVar19 * 2 + 1];
      *dst = *dst + fVar17 * fVar3 + fVar18 * fVar4;
      dst[1] = dst[1] + fVar17 * fVar5 + fVar18 * fVar6;
      dst[2] = dst[2] + fVar17 * fVar2 + fVar18 * fVar8;
      dst[3] = dst[3] + fVar17 * fVar1 + fVar18 * fVar7;
      dst[4] = fVar17 * fVar12 + fVar18 * fVar16 + dst[4];
      dst[5] = fVar17 * fVar11 + fVar18 * fVar15 + dst[5];
      dst[6] = fVar17 * fVar10 + fVar18 * fVar14 + dst[6];
      dst[7] = fVar17 * fVar9 + fVar18 * fVar13 + dst[7];
      dst = dst + 8;
      lVar19 = lVar19 + 1;
    } while (toMix != (uint32_t)lVar19);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_2in_8out_Scalar(
	uint32_t toMix,
	uint32_t UNUSED1,
	uint32_t UNUSED2,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i;
	for (i = 0; i < toMix; i += 1, src += 2, dst += 8)
	{
		dst[0] += (
			(src[0] * coefficients[0]) +
			(src[1] * coefficients[1])
		);
		dst[1] += (
			(src[0] * coefficients[2]) +
			(src[1] * coefficients[3])
		);
		dst[2] += (
			(src[0] * coefficients[4]) +
			(src[1] * coefficients[5])
		);
		dst[3] += (
			(src[0] * coefficients[6]) +
			(src[1] * coefficients[7])
		);
		dst[4] += (
			(src[0] * coefficients[8]) +
			(src[1] * coefficients[9])
		);
		dst[5] += (
			(src[0] * coefficients[10]) +
			(src[1] * coefficients[11])
		);
		dst[6] += (
			(src[0] * coefficients[12]) +
			(src[1] * coefficients[13])
		);
		dst[7] += (
			(src[0] * coefficients[14]) +
			(src[1] * coefficients[15])
		);
	}
}